

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O1

ReadFileResult cmCMakePresetsGraphInternal::PresetStringHelper(string *out,Value *value)

{
  ReadFileResult RVar1;
  int iVar2;
  string local_38;
  
  if (PresetStringHelper(std::__cxx11::string&,Json::Value_const*)::helper_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&PresetStringHelper(std::__cxx11::string&,Json::Value_const*)::
                                 helper_abi_cxx11_);
    if (iVar2 != 0) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38);
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::String
                (&PresetStringHelper(std::__cxx11::string&,Json::Value_const*)::helper_abi_cxx11_,
                 READ_OK,INVALID_PRESET,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      __cxa_atexit(std::_Function_base::~_Function_base,
                   &PresetStringHelper(std::__cxx11::string&,Json::Value_const*)::helper_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&PresetStringHelper(std::__cxx11::string&,Json::Value_const*)::
                           helper_abi_cxx11_);
    }
  }
  local_38._M_dataplus._M_p = (pointer)value;
  if (PresetStringHelper(std::__cxx11::string&,Json::Value_const*)::helper_abi_cxx11_.
      super__Function_base._M_manager != (_Manager_type)0x0) {
    RVar1 = (*PresetStringHelper(std::__cxx11::string&,Json::Value_const*)::helper_abi_cxx11_.
              _M_invoker)((_Any_data *)
                          &PresetStringHelper(std::__cxx11::string&,Json::Value_const*)::
                           helper_abi_cxx11_,out,(Value **)&local_38);
    return RVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PresetStringHelper(
  std::string& out, const Json::Value* value)
{
  static auto const helper = JSONHelperBuilder::String(
    ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESET);

  return helper(out, value);
}